

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O3

float __thiscall
Outputs::Speaker::
LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC,_Yamaha::OPL::OPLL>_>,_false>
::get_ideal_clock_rate_in_range
          (LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC,_Yamaha::OPL::OPLL>_>,_false>
           *this,float minimum,float maximum)

{
  float fVar1;
  int iVar2;
  float fVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->filter_parameters_mutex_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  fVar1 = (this->filter_parameters_).input_cycles_per_second;
  fVar3 = (this->filter_parameters_).high_frequency_cutoff;
  if (0.0 < fVar3) {
    fVar3 = fVar3 * 3.0;
    if ((fVar1 == fVar3) && (!NAN(fVar1) && !NAN(fVar3))) goto LAB_003425e7;
  }
  if ((fVar1 < minimum) || (fVar3 = fVar1, maximum < fVar1)) {
    fVar3 = (float)(~-(uint)(fVar1 < minimum) & (uint)maximum |
                   (uint)minimum & -(uint)(fVar1 < minimum));
  }
LAB_003425e7:
  pthread_mutex_unlock((pthread_mutex_t *)&this->filter_parameters_mutex_);
  return fVar3;
}

Assistant:

float get_ideal_clock_rate_in_range(float minimum, float maximum) final {
			std::lock_guard lock_guard(filter_parameters_mutex_);

			// Return twice the cut off, if applicable.
			if(	filter_parameters_.high_frequency_cutoff > 0.0f &&
				filter_parameters_.input_cycles_per_second >= filter_parameters_.high_frequency_cutoff * 3.0f &&
				filter_parameters_.input_cycles_per_second <= filter_parameters_.high_frequency_cutoff * 3.0f)
					return filter_parameters_.high_frequency_cutoff * 3.0f;

			// Return exactly the input rate if possible.
			if(	filter_parameters_.input_cycles_per_second >= minimum &&
				filter_parameters_.input_cycles_per_second <= maximum)
					return filter_parameters_.input_cycles_per_second;

			// If the input rate is lower, return the minimum...
			if(filter_parameters_.input_cycles_per_second < minimum)
				return minimum;

			// ... otherwise, return the maximum.
			return maximum;
		}